

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction_util.cpp
# Opt level: O2

void SignTransactionResultToJSON
               (CMutableTransaction *mtx,bool complete,
               map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
               *coins,map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
                      *input_errors,UniValue *result)

{
  uchar *puVar1;
  CScript *pCVar2;
  string str;
  string str_00;
  string key;
  string key_00;
  string str_01;
  string key_01;
  string key_02;
  string key_03;
  string key_04;
  string key_05;
  string key_06;
  string key_07;
  UniValue val;
  UniValue val_00;
  UniValue val_01;
  UniValue val_02;
  UniValue val_03;
  UniValue val_04;
  UniValue val_05;
  UniValue val_06;
  UniValue val_07;
  UniValue val_08;
  UniValue val_09;
  bool bVar3;
  reference pvVar4;
  _Base_ptr p_Var5;
  UniValue *this;
  vector<UniValue,_std::allocator<UniValue>_> *vec;
  UniValue *pUVar6;
  CTxOut *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  _Base_ptr p_Var10;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  undefined8 in_stack_fffffffffffff930;
  _Base_ptr p_Var11;
  _Base_ptr *local_6c8;
  _Base_ptr local_6c0;
  undefined7 uStack_6b8;
  bool complete_local;
  undefined1 local_6b0 [32];
  undefined1 auStack_690 [32];
  string local_658 [32];
  UniValue local_638;
  string local_5e0 [32];
  UniValue entry;
  UniValue local_540;
  string local_4e8 [32];
  undefined1 *local_4c8;
  undefined8 local_4c0;
  undefined1 local_4b8 [16];
  UniValue vErrors;
  UniValue local_450;
  UniValue local_3f8;
  string local_3a0 [32];
  UniValue local_380;
  string local_328 [32];
  UniValue local_308;
  string local_2b0 [32];
  UniValue local_290;
  string local_238 [32];
  UniValue local_218;
  undefined1 *local_1c0;
  undefined8 local_1b8;
  undefined1 local_1b0 [16];
  UniValue witness;
  UniValue local_148;
  string local_f0 [32];
  UniValue local_d0;
  string local_78 [32];
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_4c8 = local_4b8;
  local_4c0 = 0;
  local_4b8[0] = 0;
  str._M_string_length = (size_type)coins;
  str._M_dataplus._M_p = (pointer)mtx;
  str.field_2._M_allocated_capacity = (size_type)result;
  str.field_2._8_8_ = in_stack_fffffffffffff930;
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)input_errors;
  complete_local = complete;
  UniValue::UniValue(&vErrors,VARR,str);
  std::__cxx11::string::~string((string *)&local_4c8);
  p_Var11 = &(input_errors->_M_t)._M_impl.super__Rb_tree_header._M_header;
  p_Var5 = (input_errors->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    p_Var10 = p_Var5;
    if (p_Var10 == p_Var11) {
      std::__cxx11::string::string<std::allocator<char>>
                (local_4e8,"hex",(allocator<char> *)&local_148);
      CTransaction::CTransaction((CTransaction *)&entry,mtx);
      pUVar6 = result;
      EncodeHexTx_abi_cxx11_((string *)&local_d0,(CTransaction *)&entry);
      UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (&local_540,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d0);
      key_05._M_string_length = (size_type)coins;
      key_05._M_dataplus._M_p = (pointer)mtx;
      key_05.field_2._M_allocated_capacity = (size_type)pUVar6;
      key_05.field_2._8_8_ = p_Var11;
      val_07.val._M_dataplus._M_p = (pointer)local_6c0;
      val_07._0_8_ = local_6c8;
      val_07.val._M_string_length._0_7_ = uStack_6b8;
      val_07.val._M_string_length._7_1_ = complete_local;
      val_07.val.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )local_6b0._0_16_;
      val_07.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_6b0._16_8_;
      val_07.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_6b0._24_8_;
      val_07.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)auStack_690._0_8_;
      val_07.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)auStack_690._8_24_;
      UniValue::pushKV(result,key_05,val_07);
      UniValue::~UniValue(&local_540);
      std::__cxx11::string::~string((string *)&local_d0);
      CTransaction::~CTransaction((CTransaction *)&entry);
      std::__cxx11::string::~string(local_4e8);
      std::__cxx11::string::string<std::allocator<char>>
                (local_5e0,"complete",(allocator<char> *)&entry);
      UniValue::UniValue<bool_&,_bool,_true>(&local_638,&complete_local);
      key_06._M_string_length = (size_type)coins;
      key_06._M_dataplus._M_p = (pointer)mtx;
      key_06.field_2._M_allocated_capacity = (size_type)pUVar6;
      key_06.field_2._8_8_ = p_Var11;
      val_08.val._M_dataplus._M_p = (pointer)local_6c0;
      val_08._0_8_ = local_6c8;
      val_08.val._M_string_length._0_7_ = uStack_6b8;
      val_08.val._M_string_length._7_1_ = complete_local;
      val_08.val.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )local_6b0._0_16_;
      val_08.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_6b0._16_8_;
      val_08.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_6b0._24_8_;
      val_08.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)auStack_690._0_8_;
      val_08.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)auStack_690._8_24_;
      UniValue::pushKV(result,key_06,val_08);
      UniValue::~UniValue(&local_638);
      std::__cxx11::string::~string(local_5e0);
      if (vErrors.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          vErrors.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_start) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&entry,"errors",(allocator<char> *)&local_d0);
        bVar3 = UniValue::exists(result,(string *)&entry);
        std::__cxx11::string::~string((string *)&entry);
        if (bVar3) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&entry,"errors",(allocator<char> *)&local_d0);
          this = UniValue::operator[](result,(string *)&entry);
          vec = UniValue::getValues(this);
          UniValue::push_backV(&vErrors,vec);
          std::__cxx11::string::~string((string *)&entry);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  (local_658,"errors",(allocator<char> *)&entry);
        UniValue::UniValue((UniValue *)local_6b0,&vErrors);
        key_07._M_string_length = (size_type)coins;
        key_07._M_dataplus._M_p = (pointer)mtx;
        key_07.field_2._M_allocated_capacity = (size_type)pUVar6;
        key_07.field_2._8_8_ = p_Var11;
        val_09.val._M_dataplus._M_p = (pointer)local_6c0;
        val_09._0_8_ = local_6c8;
        val_09.val._M_string_length._0_7_ = uStack_6b8;
        val_09.val._M_string_length._7_1_ = complete_local;
        val_09.val.field_2 =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              )local_6b0._0_16_;
        val_09.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_6b0._16_8_;
        val_09.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_6b0._24_8_;
        val_09.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)auStack_690._0_8_;
        val_09.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data =
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)auStack_690._8_24_;
        UniValue::pushKV(result,key_07,val_09);
        UniValue::~UniValue((UniValue *)local_6b0);
        std::__cxx11::string::~string(local_658);
      }
      UniValue::~UniValue(&vErrors);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
LAB_0059e2aa:
      __stack_chk_fail();
    }
    local_6c8 = &p_Var10[1]._M_parent;
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_6c8,"Missing amount");
    if (bVar3) {
      pUVar6 = (UniValue *)__cxa_allocate_exception(0x58);
      pvVar4 = std::vector<CTxIn,_std::allocator<CTxIn>_>::at
                         (&mtx->vin,(long)(int)p_Var10[1]._M_color);
      this_00 = &std::
                 map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                 ::at(coins,&pvVar4->prevout)->out;
      CTxOut::ToString_abi_cxx11_((string *)&local_d0,this_00);
      tinyformat::format<std::__cxx11::string>
                ((string *)&entry,(tinyformat *)"Missing amount for %s",(char *)&local_d0,args);
      JSONRPCError(pUVar6,-3,(string *)&entry);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pUVar6,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_0059e2aa;
    }
    pvVar4 = std::vector<CTxIn,_std::allocator<CTxIn>_>::at
                       (&mtx->vin,(long)(int)p_Var10[1]._M_color);
    local_58 = local_48;
    local_50 = 0;
    local_48[0] = 0;
    str_00._M_string_length = (size_type)coins;
    str_00._M_dataplus._M_p = (pointer)mtx;
    str_00.field_2._M_allocated_capacity = (size_type)result;
    str_00.field_2._8_8_ = p_Var11;
    UniValue::UniValue(&entry,VOBJ,str_00);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string<std::allocator<char>>(local_78,"txid",(allocator<char> *)&witness);
    base_blob<256u>::ToString_abi_cxx11_((string *)&local_148,(base_blob<256u> *)pvVar4);
    UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_148);
    key._M_string_length = (size_type)coins;
    key._M_dataplus._M_p = (pointer)mtx;
    key.field_2._M_allocated_capacity = (size_type)result;
    key.field_2._8_8_ = p_Var11;
    val_01.val._M_dataplus._M_p = (pointer)p_Var10;
    val_01._0_8_ = local_6c8;
    val_01.val._M_string_length._0_7_ = uStack_6b8;
    val_01.val._M_string_length._7_1_ = complete_local;
    val_01.val.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )local_6b0._0_16_;
    val_01.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_6b0._16_8_;
    val_01.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_6b0._24_8_;
    val_01.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)auStack_690._0_8_;
    val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data =
         (_Vector_base<UniValue,_std::allocator<UniValue>_>)
         (_Vector_base<UniValue,_std::allocator<UniValue>_>)auStack_690._8_24_;
    UniValue::pushKV(&entry,key,val_01);
    UniValue::~UniValue(&local_d0);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::string<std::allocator<char>>
              (local_f0,"vout",(allocator<char> *)&local_218);
    witness._0_8_ = ZEXT48((pvVar4->prevout).n);
    UniValue::UniValue<unsigned_long,_unsigned_long,_true>(&local_148,(unsigned_long *)&witness);
    key_00._M_string_length = (size_type)coins;
    key_00._M_dataplus._M_p = (pointer)mtx;
    key_00.field_2._M_allocated_capacity = (size_type)result;
    key_00.field_2._8_8_ = p_Var11;
    val_02.val._M_dataplus._M_p = (pointer)p_Var10;
    val_02._0_8_ = local_6c8;
    val_02.val._M_string_length._0_7_ = uStack_6b8;
    val_02.val._M_string_length._7_1_ = complete_local;
    val_02.val.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )local_6b0._0_16_;
    val_02.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_6b0._16_8_;
    val_02.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_6b0._24_8_;
    val_02.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)auStack_690._0_8_;
    val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data =
         (_Vector_base<UniValue,_std::allocator<UniValue>_>)
         (_Vector_base<UniValue,_std::allocator<UniValue>_>)auStack_690._8_24_;
    UniValue::pushKV(&entry,key_00,val_02);
    UniValue::~UniValue(&local_148);
    std::__cxx11::string::~string(local_f0);
    local_1c0 = local_1b0;
    local_1b8 = 0;
    local_1b0[0] = 0;
    str_01._M_string_length = (size_type)coins;
    str_01._M_dataplus._M_p = (pointer)mtx;
    str_01.field_2._M_allocated_capacity = (size_type)result;
    str_01.field_2._8_8_ = p_Var11;
    UniValue::UniValue(&witness,VARR,str_01);
    std::__cxx11::string::~string((string *)&local_1c0);
    uVar8 = 0;
    while( true ) {
      uVar9 = (ulong)uVar8;
      args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (pvVar4->scriptWitness).stack.
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(pvVar4->scriptWitness).stack.
                         super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)args) / 0x18) <= uVar9)
      break;
      puVar1 = ((_Vector_impl_data *)&(((_Rep_type *)&args->_M_dataplus)->_M_impl).field_0x0)[uVar9]
               ._M_start;
      s.m_size = (long)*(pointer *)
                        ((long)&(((_Rb_tree_header *)&args->_M_string_length)->_M_header)._M_color +
                        uVar9 * 3 * 8) - (long)puVar1;
      s.m_data = puVar1;
      HexStr_abi_cxx11_((string *)&local_290,s);
      UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (&local_218,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_290);
      val.val._M_dataplus._M_p = (pointer)coins;
      val._0_8_ = mtx;
      val.val._M_string_length = (size_type)result;
      val.val.field_2._M_allocated_capacity = (size_type)p_Var11;
      val.val.field_2._8_8_ = local_6c8;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var10;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_7_ = uStack_6b8;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._7_1_ = complete_local;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_6b0._0_8_;
      val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)local_6b0._8_24_;
      UniValue::push_back(&witness,val);
      UniValue::~UniValue(&local_218);
      std::__cxx11::string::~string((string *)&local_290);
      uVar8 = uVar8 + 1;
    }
    std::__cxx11::string::string<std::allocator<char>>
              (local_238,"witness",(allocator<char> *)&local_308);
    UniValue::UniValue(&local_290,&witness);
    key_01._M_string_length = (size_type)coins;
    key_01._M_dataplus._M_p = (pointer)mtx;
    key_01.field_2._M_allocated_capacity = (size_type)result;
    key_01.field_2._8_8_ = p_Var11;
    val_03.val._M_dataplus._M_p = (pointer)p_Var10;
    val_03._0_8_ = local_6c8;
    val_03.val._M_string_length._0_7_ = uStack_6b8;
    val_03.val._M_string_length._7_1_ = complete_local;
    val_03.val.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )local_6b0._0_16_;
    val_03.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_6b0._16_8_;
    val_03.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_6b0._24_8_;
    val_03.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)auStack_690._0_8_;
    val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data =
         (_Vector_base<UniValue,_std::allocator<UniValue>_>)
         (_Vector_base<UniValue,_std::allocator<UniValue>_>)auStack_690._8_24_;
    UniValue::pushKV(&entry,key_01,val_03);
    UniValue::~UniValue(&local_290);
    std::__cxx11::string::~string(local_238);
    std::__cxx11::string::string<std::allocator<char>>
              (local_2b0,"scriptSig",(allocator<char> *)&local_3f8);
    uVar8 = (pvVar4->scriptSig).super_CScriptBase._size;
    uVar7 = uVar8 - 0x1d;
    pCVar2 = (CScript *)(pvVar4->scriptSig).super_CScriptBase._union.indirect_contents.indirect;
    if (uVar8 < 0x1d) {
      uVar7 = uVar8;
      pCVar2 = &pvVar4->scriptSig;
    }
    s_00.m_size._0_4_ = uVar7;
    s_00.m_data = (uchar *)pCVar2;
    s_00.m_size._4_4_ = 0;
    HexStr_abi_cxx11_((string *)&local_380,s_00);
    UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_308,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_380);
    key_02._M_string_length = (size_type)coins;
    key_02._M_dataplus._M_p = (pointer)mtx;
    key_02.field_2._M_allocated_capacity = (size_type)result;
    key_02.field_2._8_8_ = p_Var11;
    val_04.val._M_dataplus._M_p = (pointer)p_Var10;
    val_04._0_8_ = local_6c8;
    val_04.val._M_string_length._0_7_ = uStack_6b8;
    val_04.val._M_string_length._7_1_ = complete_local;
    val_04.val.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )local_6b0._0_16_;
    val_04.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_6b0._16_8_;
    val_04.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_6b0._24_8_;
    val_04.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)auStack_690._0_8_;
    val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data =
         (_Vector_base<UniValue,_std::allocator<UniValue>_>)
         (_Vector_base<UniValue,_std::allocator<UniValue>_>)auStack_690._8_24_;
    UniValue::pushKV(&entry,key_02,val_04);
    UniValue::~UniValue(&local_308);
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::string::~string(local_2b0);
    std::__cxx11::string::string<std::allocator<char>>
              (local_328,"sequence",(allocator<char> *)&local_450);
    local_3f8._0_8_ = ZEXT48(pvVar4->nSequence);
    UniValue::UniValue<unsigned_long,_unsigned_long,_true>(&local_380,(unsigned_long *)&local_3f8);
    key_03._M_string_length = (size_type)coins;
    key_03._M_dataplus._M_p = (pointer)mtx;
    key_03.field_2._M_allocated_capacity = (size_type)result;
    key_03.field_2._8_8_ = p_Var11;
    val_05.val._M_dataplus._M_p = (pointer)p_Var10;
    val_05._0_8_ = local_6c8;
    val_05.val._M_string_length._0_7_ = uStack_6b8;
    val_05.val._M_string_length._7_1_ = complete_local;
    val_05.val.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )local_6b0._0_16_;
    val_05.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_6b0._16_8_;
    val_05.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_6b0._24_8_;
    val_05.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)auStack_690._0_8_;
    val_05.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data =
         (_Vector_base<UniValue,_std::allocator<UniValue>_>)
         (_Vector_base<UniValue,_std::allocator<UniValue>_>)auStack_690._8_24_;
    UniValue::pushKV(&entry,key_03,val_05);
    UniValue::~UniValue(&local_380);
    std::__cxx11::string::~string(local_328);
    std::__cxx11::string::string<std::allocator<char>>
              (local_3a0,"error",(allocator<char> *)&local_450);
    UniValue::
    UniValue<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_3f8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6c8);
    key_04._M_string_length = (size_type)coins;
    key_04._M_dataplus._M_p = (pointer)mtx;
    key_04.field_2._M_allocated_capacity = (size_type)result;
    key_04.field_2._8_8_ = p_Var11;
    val_06.val._M_dataplus._M_p = (pointer)p_Var10;
    val_06._0_8_ = local_6c8;
    val_06.val._M_string_length._0_7_ = uStack_6b8;
    val_06.val._M_string_length._7_1_ = complete_local;
    val_06.val.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )local_6b0._0_16_;
    val_06.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_6b0._16_8_;
    val_06.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_6b0._24_8_;
    val_06.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)auStack_690._0_8_;
    val_06.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data =
         (_Vector_base<UniValue,_std::allocator<UniValue>_>)
         (_Vector_base<UniValue,_std::allocator<UniValue>_>)auStack_690._8_24_;
    UniValue::pushKV(&entry,key_04,val_06);
    UniValue::~UniValue(&local_3f8);
    std::__cxx11::string::~string(local_3a0);
    UniValue::UniValue(&local_450,&entry);
    val_00.val._M_dataplus._M_p = (pointer)coins;
    val_00._0_8_ = mtx;
    val_00.val._M_string_length = (size_type)result;
    val_00.val.field_2._M_allocated_capacity = (size_type)p_Var11;
    val_00.val.field_2._8_8_ = local_6c8;
    val_00.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var10;
    val_00.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_7_ = uStack_6b8;
    val_00.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._7_1_ = complete_local;
    val_00.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_6b0._0_8_;
    val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data =
         (_Vector_base<UniValue,_std::allocator<UniValue>_>)
         (_Vector_base<UniValue,_std::allocator<UniValue>_>)local_6b0._8_24_;
    UniValue::push_back(&vErrors,val_00);
    UniValue::~UniValue(&local_450);
    UniValue::~UniValue(&witness);
    UniValue::~UniValue(&entry);
    p_Var5 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var10);
    local_6c0 = p_Var10;
  } while( true );
}

Assistant:

void SignTransactionResultToJSON(CMutableTransaction& mtx, bool complete, const std::map<COutPoint, Coin>& coins, const std::map<int, bilingual_str>& input_errors, UniValue& result)
{
    // Make errors UniValue
    UniValue vErrors(UniValue::VARR);
    for (const auto& err_pair : input_errors) {
        if (err_pair.second.original == "Missing amount") {
            // This particular error needs to be an exception for some reason
            throw JSONRPCError(RPC_TYPE_ERROR, strprintf("Missing amount for %s", coins.at(mtx.vin.at(err_pair.first).prevout).out.ToString()));
        }
        TxInErrorToJSON(mtx.vin.at(err_pair.first), vErrors, err_pair.second.original);
    }

    result.pushKV("hex", EncodeHexTx(CTransaction(mtx)));
    result.pushKV("complete", complete);
    if (!vErrors.empty()) {
        if (result.exists("errors")) {
            vErrors.push_backV(result["errors"].getValues());
        }
        result.pushKV("errors", std::move(vErrors));
    }
}